

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PipelineResourceSignatureBase.cpp
# Opt level: O0

void Diligent::ReserveSpaceForPipelineResourceSignatureDesc
               (FixedLinearAllocator *Allocator,PipelineResourceSignatureDesc *Desc)

{
  Char *pCVar1;
  Char *pCVar2;
  undefined1 local_108 [8];
  string msg_5;
  string msg_4;
  char *SamOrTexName;
  undefined1 local_b8 [4];
  Uint32 i_1;
  string msg_3;
  string msg_2;
  string msg_1;
  undefined1 local_48 [8];
  string msg;
  PipelineResourceDesc *Res;
  Uint32 i;
  PipelineResourceSignatureDesc *Desc_local;
  FixedLinearAllocator *Allocator_local;
  
  FixedLinearAllocator::AddSpace<Diligent::PipelineResourceDesc>
            (Allocator,(ulong)Desc->NumResources);
  FixedLinearAllocator::AddSpace<Diligent::ImmutableSamplerDesc>
            (Allocator,(ulong)Desc->NumImmutableSamplers);
  for (Res._4_4_ = 0; Res._4_4_ < Desc->NumResources; Res._4_4_ = Res._4_4_ + 1) {
    msg.field_2._8_8_ = Desc->Resources + Res._4_4_;
    if (((PipelineResourceDesc *)msg.field_2._8_8_)->Name == (Char *)0x0) {
      FormatString<char[97]>((string *)local_48,(char (*) [97])0xcc79f8);
      pCVar1 = (Char *)std::__cxx11::string::c_str();
      DebugAssertionFailed
                (pCVar1,"ReserveSpaceForPipelineResourceSignatureDesc",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/PipelineResourceSignatureBase.cpp"
                 ,0x1b8);
      std::__cxx11::string::~string((string *)local_48);
    }
    if (**(char **)msg.field_2._8_8_ == '\0') {
      FormatString<char[98]>((string *)((long)&msg_2.field_2 + 8),(char (*) [98])0xcc7a69);
      pCVar1 = (Char *)std::__cxx11::string::c_str();
      DebugAssertionFailed
                (pCVar1,"ReserveSpaceForPipelineResourceSignatureDesc",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/PipelineResourceSignatureBase.cpp"
                 ,0x1b9);
      std::__cxx11::string::~string((string *)(msg_2.field_2._M_local_buf + 8));
    }
    if (*(int *)(msg.field_2._8_8_ + 8) == 0) {
      FormatString<char[120]>
                ((string *)((long)&msg_3.field_2 + 8),
                 (char (*) [120])
                 "ShaderStages can\'t be SHADER_TYPE_UNKNOWN. This error should\'ve been caught by ValidatePipelineResourceSignatureDesc()."
                );
      pCVar1 = (Char *)std::__cxx11::string::c_str();
      DebugAssertionFailed
                (pCVar1,"ReserveSpaceForPipelineResourceSignatureDesc",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/PipelineResourceSignatureBase.cpp"
                 ,0x1ba);
      std::__cxx11::string::~string((string *)(msg_3.field_2._M_local_buf + 8));
    }
    if (*(int *)(msg.field_2._8_8_ + 0xc) == 0) {
      FormatString<char[99]>
                ((string *)local_b8,
                 (char (*) [99])
                 "ArraySize can\'t be 0. This error should\'ve been caught by ValidatePipelineResourceSignatureDesc()."
                );
      pCVar1 = (Char *)std::__cxx11::string::c_str();
      DebugAssertionFailed
                (pCVar1,"ReserveSpaceForPipelineResourceSignatureDesc",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/PipelineResourceSignatureBase.cpp"
                 ,0x1bb);
      std::__cxx11::string::~string((string *)local_b8);
    }
    FixedLinearAllocator::AddSpaceForString(Allocator,*(Char **)msg.field_2._8_8_,0);
  }
  for (SamOrTexName._4_4_ = 0; SamOrTexName._4_4_ < Desc->NumImmutableSamplers;
      SamOrTexName._4_4_ = SamOrTexName._4_4_ + 1) {
    pCVar1 = Desc->ImmutableSamplers[SamOrTexName._4_4_].SamplerOrTextureName;
    if (pCVar1 == (Char *)0x0) {
      FormatString<char[113]>
                ((string *)((long)&msg_5.field_2 + 8),
                 (char (*) [113])
                 "SamplerOrTextureName can\'t be null. This error should\'ve been caught by ValidatePipelineResourceSignatureDesc()."
                );
      pCVar2 = (Char *)std::__cxx11::string::c_str();
      DebugAssertionFailed
                (pCVar2,"ReserveSpaceForPipelineResourceSignatureDesc",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/PipelineResourceSignatureBase.cpp"
                 ,0x1c3);
      std::__cxx11::string::~string((string *)(msg_5.field_2._M_local_buf + 8));
    }
    if (*pCVar1 == '\0') {
      FormatString<char[114]>
                ((string *)local_108,
                 (char (*) [114])
                 "SamplerOrTextureName can\'t be empty. This error should\'ve been caught by ValidatePipelineResourceSignatureDesc()."
                );
      pCVar2 = (Char *)std::__cxx11::string::c_str();
      DebugAssertionFailed
                (pCVar2,"ReserveSpaceForPipelineResourceSignatureDesc",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/PipelineResourceSignatureBase.cpp"
                 ,0x1c4);
      std::__cxx11::string::~string((string *)local_108);
    }
    FixedLinearAllocator::AddSpaceForString(Allocator,pCVar1,0);
    FixedLinearAllocator::AddSpaceForString
              (Allocator,
               Desc->ImmutableSamplers[SamOrTexName._4_4_].Desc.super_DeviceObjectAttribs.Name,0);
  }
  if ((Desc->UseCombinedTextureSamplers & 1U) != 0) {
    FixedLinearAllocator::AddSpaceForString(Allocator,Desc->CombinedSamplerSuffix,0);
  }
  return;
}

Assistant:

void ReserveSpaceForPipelineResourceSignatureDesc(FixedLinearAllocator& Allocator, const PipelineResourceSignatureDesc& Desc)
{
    Allocator.AddSpace<PipelineResourceDesc>(Desc.NumResources);
    Allocator.AddSpace<ImmutableSamplerDesc>(Desc.NumImmutableSamplers);

    for (Uint32 i = 0; i < Desc.NumResources; ++i)
    {
        const PipelineResourceDesc& Res = Desc.Resources[i];

        VERIFY(Res.Name != nullptr, "Name can't be null. This error should've been caught by ValidatePipelineResourceSignatureDesc().");
        VERIFY(Res.Name[0] != '\0', "Name can't be empty. This error should've been caught by ValidatePipelineResourceSignatureDesc().");
        VERIFY(Res.ShaderStages != SHADER_TYPE_UNKNOWN, "ShaderStages can't be SHADER_TYPE_UNKNOWN. This error should've been caught by ValidatePipelineResourceSignatureDesc().");
        VERIFY(Res.ArraySize != 0, "ArraySize can't be 0. This error should've been caught by ValidatePipelineResourceSignatureDesc().");

        Allocator.AddSpaceForString(Res.Name);
    }

    for (Uint32 i = 0; i < Desc.NumImmutableSamplers; ++i)
    {
        const char* SamOrTexName = Desc.ImmutableSamplers[i].SamplerOrTextureName;
        VERIFY(SamOrTexName != nullptr, "SamplerOrTextureName can't be null. This error should've been caught by ValidatePipelineResourceSignatureDesc().");
        VERIFY(SamOrTexName[0] != '\0', "SamplerOrTextureName can't be empty. This error should've been caught by ValidatePipelineResourceSignatureDesc().");
        Allocator.AddSpaceForString(SamOrTexName);
        Allocator.AddSpaceForString(Desc.ImmutableSamplers[i].Desc.Name);
    }

    if (Desc.UseCombinedTextureSamplers)
        Allocator.AddSpaceForString(Desc.CombinedSamplerSuffix);
}